

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

void __thiscall
JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
Resize(WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true> *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  code *pcVar3;
  bool bVar4;
  uint prime;
  BOOL BVar5;
  int iVar6;
  hash_t hVar7;
  Recycler *pRVar8;
  undefined4 *puVar9;
  int *__s;
  WeakRefDictionaryEntry<Js::Type,_bool> *dst;
  Type *pTVar10;
  ulong uVar11;
  ulong dstCount;
  size_t sVar12;
  long lVar13;
  int *piVar14;
  undefined4 uVar15;
  undefined4 uVar17;
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined8 extraout_XMM1_Qa_03;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined8 extraout_XMM1_Qb_03;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 local_70 [8];
  TrackAllocData data;
  int modIndex;
  undefined1 auVar16 [16];
  
  data._36_4_ = 0x4b;
  prime = PrimePolicy::GetPrime(this->count * 2,(int *)&data.field_0x24);
  if ((int)prime <= this->count) {
    Js::Throw::OutOfMemory();
  }
  dstCount = (ulong)(int)prime;
  local_70 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18ff27;
  data.filename._0_4_ = 0x165;
  data.plusSize = dstCount;
  pRVar8 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (prime == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar8,(TrackAllocData *)0x0);
    __s = (int *)&DAT_00000008;
  }
  else {
    sVar12 = 0xffffffffffffffff;
    if (-1 < (int)prime) {
      sVar12 = dstCount * 4;
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb;
      in_XMM1._0_8_ = extraout_XMM1_Qa;
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_007c56cb;
      *puVar9 = 0;
    }
    __s = (int *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                           (pRVar8,sVar12);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_00;
      in_XMM1._0_8_ = extraout_XMM1_Qa_00;
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_007c56cb;
      *puVar9 = 0;
    }
    if (0 < (int)prime) {
      memset(__s,0xff,(ulong)prime << 2);
    }
  }
  local_70 = (undefined1  [8])&WeakRefDictionaryEntry<Js::Type,bool>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18ff27;
  data.filename._0_4_ = 0x167;
  data.plusSize = dstCount;
  pRVar8 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (prime == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar8,(TrackAllocData *)0x0);
    dst = (WeakRefDictionaryEntry<Js::Type,_bool> *)&DAT_00000008;
  }
  else {
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dstCount;
    sVar12 = 0xffffffffffffffff;
    if (SUB168(auVar18 * ZEXT816(0x18),8) == 0) {
      sVar12 = SUB168(auVar18 * ZEXT816(0x18),0);
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_01;
      in_XMM1._0_8_ = extraout_XMM1_Qa_01;
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_007c56cb;
      *puVar9 = 0;
    }
    if (sVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_02;
      in_XMM1._0_8_ = extraout_XMM1_Qa_02;
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar4) goto LAB_007c56cb;
      *puVar9 = 0;
    }
    dst = (WeakRefDictionaryEntry<Js::Type,_bool> *)
          Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                    (pRVar8,sVar12);
    if (dst == (WeakRefDictionaryEntry<Js::Type,_bool> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      in_XMM1._8_8_ = extraout_XMM1_Qb_03;
      in_XMM1._0_8_ = extraout_XMM1_Qa_03;
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_007c56cb;
      *puVar9 = 0;
    }
    uVar1 = dstCount * 0x18 - 0x18;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar15 = SUB164(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar17 = (undefined4)(uVar1 / 0x180000000);
    auVar16._0_8_ = CONCAT44(uVar17,uVar15);
    auVar16._8_4_ = uVar15;
    auVar16._12_4_ = uVar17;
    pTVar10 = &dst->key;
    uVar11 = 0;
    auVar18 = pmovsxbq(in_XMM1,0x100);
    do {
      if ((bool)(~((long)(auVar16._0_8_ >> 4 | 0x8000000000000000) <
                  (long)(uVar11 ^ 0x8000000000000000)) & 1)) {
        pTVar10->ptr = (RecyclerWeakReference<Js::Type> *)0x0;
      }
      auVar19._8_4_ = (int)uVar11;
      auVar19._0_8_ = uVar11;
      auVar19._12_4_ = (int)(uVar11 >> 0x20);
      if ((long)((auVar19._8_8_ | auVar18._8_8_) ^ 0x8000000000000000) <=
          (long)(auVar16._8_8_ >> 4 | 0x8000000000000000)) {
        pTVar10[3] = (RecyclerWeakReference<Js::Type> *)0x0;
      }
      uVar11 = uVar11 + 2;
      pTVar10 = pTVar10 + 6;
    } while ((uVar1 / 0x18 + 2 & 0xfffffffffffffffe) != uVar11);
  }
  Memory::
  CopyArray<JsUtil::WeakRefDictionaryEntry<Js::Type,bool>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Type>const>,Memory::Recycler>
            (dst,dstCount,(this->entries).ptr,(long)this->count);
  iVar6 = this->count;
  if ((int)prime <= iVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
                       ,0x169,"(count < newSize)","count < newSize");
    if (!bVar4) {
LAB_007c56cb:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
    iVar6 = this->count;
  }
  this->modFunctionIndex = data._36_4_;
  if (0 < iVar6) {
    piVar14 = &dst->next;
    lVar13 = 0;
    do {
      hVar7 = PrimePolicy::ModPrime
                        (((WeakRefDictionaryEntry<Js::Type,_bool> *)(piVar14 + -1))->hash,prime,
                         this->modFunctionIndex);
      *piVar14 = __s[hVar7];
      __s[hVar7] = (int)lVar13;
      lVar13 = lVar13 + 1;
      piVar14 = piVar14 + 6;
    } while (lVar13 < this->count);
  }
  Memory::Recycler::WBSetBit((char *)&this->buckets);
  (this->buckets).ptr = __s;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buckets);
  this->size = prime;
  Memory::Recycler::WBSetBit((char *)&this->entries);
  (this->entries).ptr = dst;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
  return;
}

Assistant:

void Resize()
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int newSize = PrimePolicy::GetSize(count * 2, &modIndex);

            if (newSize <= count)
            {
                // throw OOM if we can't increase the dictionary size
                Js::Throw::OutOfMemory();
            }

            int* newBuckets = RecyclerNewArrayLeaf(recycler, int, newSize);
            for (int i = 0; i < newSize; i++) newBuckets[i] = -1;
            EntryType* newEntries = RecyclerNewArray(recycler, EntryType, newSize);
            CopyArray<EntryType, Field(const RecyclerWeakReference<TKey>*)>(newEntries, newSize, entries, count);
            AnalysisAssert(count < newSize);
            modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                uint bucket = PrimePolicy::GetBucket(newEntries[i].hash, newSize, modFunctionIndex);
                newEntries[i].next = newBuckets[bucket];
                newBuckets[bucket] = i;
            }
            buckets = newBuckets;
            size = newSize;
            entries = newEntries;
        }